

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3PagerOpenSavepoint(Pager *pPager,int nSavepoint)

{
  Pgno PVar1;
  Wal *pWVar2;
  int iVar3;
  PagerSavepoint *pPVar4;
  ulong uVar5;
  Bitvec *pBVar6;
  u32 *puVar7;
  int iVar8;
  
  iVar8 = pPager->nSavepoint;
  iVar3 = 0;
  if ((iVar8 < nSavepoint) && (iVar3 = 0, pPager->useJournal != '\0')) {
    pPVar4 = (PagerSavepoint *)sqlite3Realloc(pPager->aSavepoint,nSavepoint * 0x30);
    iVar3 = 7;
    if (pPVar4 != (PagerSavepoint *)0x0) {
      memset(pPVar4 + iVar8,0,(long)(nSavepoint - iVar8) * 0x30);
      pPager->aSavepoint = pPVar4;
      puVar7 = pPVar4[iVar8].aWalData + 3;
      do {
        iVar8 = iVar8 + 1;
        PVar1 = pPager->dbSize;
        puVar7[-5] = PVar1;
        if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) ||
           (uVar5 = pPager->journalOff, (long)uVar5 < 1)) {
          uVar5 = (ulong)pPager->sectorSize;
        }
        ((PagerSavepoint *)(puVar7 + -0xb))->iOffset = uVar5;
        puVar7[-4] = pPager->nSubRec;
        pBVar6 = (Bitvec *)sqlite3Malloc(0x200);
        if (pBVar6 == (Bitvec *)0x0) {
          *(Bitvec **)(puVar7 + -7) = (Bitvec *)0x0;
          return 7;
        }
        memset(&pBVar6->nSet,0,0x1fc);
        pBVar6->iSize = PVar1;
        *(Bitvec **)(puVar7 + -7) = pBVar6;
        pWVar2 = pPager->pWal;
        if (pWVar2 != (Wal *)0x0) {
          puVar7[-3] = (pWVar2->hdr).mxFrame;
          puVar7[-2] = (pWVar2->hdr).aFrameCksum[0];
          puVar7[-1] = (pWVar2->hdr).aFrameCksum[1];
          *puVar7 = pWVar2->nCkpt;
        }
        pPager->nSavepoint = iVar8;
        puVar7 = puVar7 + 0xc;
      } while (iVar8 != nSavepoint);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerOpenSavepoint(Pager *pPager, int nSavepoint){
  int rc = SQLITE_OK;                       /* Return code */
  int nCurrent = pPager->nSavepoint;        /* Current number of savepoints */

  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );

  if( nSavepoint>nCurrent && pPager->useJournal ){
    int ii;                                 /* Iterator variable */
    PagerSavepoint *aNew;                   /* New Pager.aSavepoint array */

    /* Grow the Pager.aSavepoint array using realloc(). Return SQLITE_NOMEM
    ** if the allocation fails. Otherwise, zero the new portion in case a 
    ** malloc failure occurs while populating it in the for(...) loop below.
    */
    aNew = (PagerSavepoint *)sqlite3Realloc(
        pPager->aSavepoint, sizeof(PagerSavepoint)*nSavepoint
    );
    if( !aNew ){
      return SQLITE_NOMEM;
    }
    memset(&aNew[nCurrent], 0, (nSavepoint-nCurrent) * sizeof(PagerSavepoint));
    pPager->aSavepoint = aNew;

    /* Populate the PagerSavepoint structures just allocated. */
    for(ii=nCurrent; ii<nSavepoint; ii++){
      aNew[ii].nOrig = pPager->dbSize;
      if( isOpen(pPager->jfd) && pPager->journalOff>0 ){
        aNew[ii].iOffset = pPager->journalOff;
      }else{
        aNew[ii].iOffset = JOURNAL_HDR_SZ(pPager);
      }
      aNew[ii].iSubRec = pPager->nSubRec;
      aNew[ii].pInSavepoint = sqlite3BitvecCreate(pPager->dbSize);
      if( !aNew[ii].pInSavepoint ){
        return SQLITE_NOMEM;
      }
      if( pagerUseWal(pPager) ){
        sqlite3WalSavepoint(pPager->pWal, aNew[ii].aWalData);
      }
      pPager->nSavepoint = ii+1;
    }
    assert( pPager->nSavepoint==nSavepoint );
    assertTruncateConstraint(pPager);
  }

  return rc;
}